

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_internal_buf_squeeze(mcpl_buffer_t *buf)

{
  char *__dest;
  size_t *in_RDI;
  char *newbuf;
  char *oldbuf;
  void *__src;
  
  if (in_RDI[1] != in_RDI[2]) {
    __src = (void *)*in_RDI;
    __dest = mcpl_internal_malloc((size_t)__src);
    memcpy(__dest,__src,in_RDI[1]);
    *in_RDI = (size_t)__dest;
    free(__src);
  }
  return;
}

Assistant:

MCPL_LOCAL void mcpl_internal_buf_squeeze(mcpl_buffer_t* buf)
{
  if ( buf->size == buf->capacity )
    return;
  char * oldbuf = buf->buf;
  char * newbuf = mcpl_internal_malloc( buf->size );
  memcpy( newbuf, oldbuf, buf->size );
  buf->buf = newbuf;
  free(oldbuf);
}